

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setReadOnly(DOMNamedNodeMapImpl *this,bool readOnl,bool deep)

{
  XMLSize_t XVar1;
  DOMNodeImpl *this_00;
  undefined7 in_register_00000011;
  DOMNode *p;
  XMLSize_t i;
  ulong uVar2;
  XMLSize_t index;
  long lVar3;
  
  if ((int)CONCAT71(in_register_00000011,deep) != 0) {
    for (lVar3 = 0; lVar3 != 0xc1; lVar3 = lVar3 + 1) {
      if (this->fBuckets[lVar3] != (DOMNodeVector *)0x0) {
        XVar1 = this->fBuckets[lVar3]->nextFreeSlot;
        for (uVar2 = 0; XVar1 != uVar2; uVar2 = uVar2 + 1) {
          if (uVar2 < this->fBuckets[lVar3]->nextFreeSlot) {
            p = this->fBuckets[lVar3]->data[uVar2];
          }
          else {
            p = (DOMNode *)0x0;
          }
          this_00 = castToNodeImpl(p);
          DOMNodeImpl::setReadOnly(this_00,readOnl,true);
        }
      }
    }
  }
  return;
}

Assistant:

void DOMNamedNodeMapImpl::setReadOnly(bool readOnl, bool deep)
{
    // this->fReadOnly=readOnl;
    if(deep) {
        for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
            if(fBuckets[index]==0)
                continue;
            XMLSize_t sz = fBuckets[index]->size();
            for (XMLSize_t i=0; i<sz; ++i)
                castToNodeImpl(fBuckets[index]->elementAt(i))->setReadOnly(readOnl, deep);
        }
    }
}